

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

t_path * __thiscall
xemmai::portable::t_path::operator/(t_path *__return_storage_ptr__,t_path *this,wstring_view a_path)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  t_path *ptVar3;
  t_path local_48;
  
  paVar1 = &local_48.v_path.field_2;
  pwVar2 = (this->v_path)._M_dataplus._M_p;
  local_48.v_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_48,pwVar2,pwVar2 + (this->v_path)._M_string_length);
  ptVar3 = operator/=(&local_48,a_path);
  (__return_storage_ptr__->v_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->v_path).field_2;
  pwVar2 = (ptVar3->v_path)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar2,pwVar2 + (ptVar3->v_path)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48.v_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.v_path._M_dataplus._M_p,
                    local_48.v_path.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

t_path operator/(std::wstring_view a_path) const
	{
		return t_path(*this) /= a_path;
	}